

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O2

CURLcode Curl_output_ntlm(connectdata *conn,_Bool proxy)

{
  curlntlm cVar1;
  Curl_easy *data;
  char *hostname;
  proxy_info *ppVar2;
  CURLcode CVar3;
  char *pcVar4;
  char **ppcVar5;
  char *service;
  char *passwdp;
  int iVar6;
  undefined7 in_register_00000031;
  char *userp;
  char **ppcVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  char *base64;
  size_t len;
  ntlmdata *local_38;
  
  base64 = (char *)0x0;
  len = 0;
  iVar6 = (int)CONCAT71(in_register_00000031,proxy);
  data = conn->data;
  uVar8 = (ulong)(uint)(iVar6 << 5);
  bVar11 = iVar6 != 0;
  lVar9 = 0x430;
  ppcVar5 = &conn->user;
  if (bVar11) {
    lVar9 = 0x418;
    ppcVar5 = &(conn->http_proxy).user;
  }
  ppcVar7 = &(conn->http_proxy).passwd;
  if (!bVar11) {
    ppcVar7 = &conn->passwd;
  }
  pcVar4 = (data->set).str[(ulong)!proxy + 0x35];
  ppVar2 = &conn->http_proxy;
  if (!bVar11) {
    ppVar2 = (proxy_info *)&conn->host;
  }
  local_38 = (ntlmdata *)((conn->ntlm).nonce + (uVar8 - 8));
  passwdp = *ppcVar7;
  userp = *ppcVar5;
  hostname = (ppVar2->host).name;
  (&(data->state).authhost.done)[uVar8] = false;
  pcVar10 = "";
  if (userp == (char *)0x0) {
    userp = "";
  }
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  cVar1 = local_38->state;
  if (cVar1 == NTLMSTATE_TYPE2) {
    CVar3 = Curl_auth_create_ntlm_type3_message(data,userp,passwdp,local_38,&base64,&len);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (base64 == (char *)0x0) {
      return CURLE_OK;
    }
    (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar9 + -0x20));
    if (proxy) {
      pcVar10 = "Proxy-";
    }
    pcVar4 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar10,base64);
    *(char **)((conn->chunk).hexbuffer + lVar9 + -0x20) = pcVar4;
    (*Curl_cfree)(base64);
    if (*(long *)((conn->chunk).hexbuffer + lVar9 + -0x20) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    local_38->state = NTLMSTATE_TYPE3;
  }
  else {
    if (cVar1 == NTLMSTATE_TYPE3) {
      local_38->state = NTLMSTATE_LAST;
    }
    else if (cVar1 != NTLMSTATE_LAST) {
      service = "HTTP";
      if (pcVar4 != (char *)0x0) {
        service = pcVar4;
      }
      CVar3 = Curl_auth_create_ntlm_type1_message
                        (data,userp,passwdp,service,hostname,local_38,&base64,&len);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if (base64 == (char *)0x0) {
        return CURLE_OK;
      }
      (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar9 + -0x20));
      if (proxy) {
        pcVar10 = "Proxy-";
      }
      pcVar4 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar10,base64);
      *(char **)((conn->chunk).hexbuffer + lVar9 + -0x20) = pcVar4;
      (*Curl_cfree)(base64);
      if (*(long *)((conn->chunk).hexbuffer + lVar9 + -0x20) != 0) {
        return CURLE_OK;
      }
      return CURLE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar9 + -0x20));
    pcVar4 = (conn->chunk).hexbuffer + lVar9 + -0x20;
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
  }
  (&(data->state).authhost.done)[uVar8] = true;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_ntlm(struct connectdata *conn, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* point to the username, password, service and host */
  const char *userp;
  const char *passwdp;
  const char *service = NULL;
  const char *hostname = NULL;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  struct auth *authp;

  DEBUGASSERT(conn);
  DEBUGASSERT(conn->data);

#if defined(NTLM_NEEDS_NSS_INIT)
  if(CURLE_OK != Curl_nss_force_init(conn->data))
    return CURLE_OUT_OF_MEMORY;
#endif

  if(proxy) {
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->http_proxy.user;
    passwdp = conn->http_proxy.passwd;
    service = conn->data->set.str[STRING_PROXY_SERVICE_NAME] ?
              conn->data->set.str[STRING_PROXY_SERVICE_NAME] : "HTTP";
    hostname = conn->http_proxy.host.name;
    ntlm = &conn->proxyntlm;
    authp = &conn->data->state.authproxy;
  }
  else {
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    service = conn->data->set.str[STRING_SERVICE_NAME] ?
              conn->data->set.str[STRING_SERVICE_NAME] : "HTTP";
    hostname = conn->host.name;
    ntlm = &conn->ntlm;
    authp = &conn->data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(s_hSecDll == NULL) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(s_hSecDll == NULL)
      return err;
  }
#ifdef SECPKG_ATTR_ENDPOINT_BINDINGS
  ntlm->sslContext = conn->sslContext;
#endif
#endif

  switch(ntlm->state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(conn->data, userp, passwdp,
                                                 service, hostname,
                                                 ntlm, &base64,
                                                 &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** Header %s\n ", *allocuserpwd));
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(conn->data, userp, passwdp,
                                                 ntlm, &base64, &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** %s\n ", *allocuserpwd));

      ntlm->state = NTLMSTATE_TYPE3; /* we send a type-3 */
      authp->done = TRUE;
    }
    break;

  case NTLMSTATE_TYPE3:
    /* connection is already authenticated,
     * don't send a header in future requests */
    ntlm->state = NTLMSTATE_LAST;
    /* FALLTHROUGH */
  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }

  return CURLE_OK;
}